

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Transform *
pbrt::Rotate(Transform *__return_storage_ptr__,Float sinTheta,Float cosTheta,Vector3f axis)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int i_1;
  undefined1 (*pauVar7) [16];
  int i;
  long lVar8;
  undefined8 *puVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  SquareMatrix<4> m;
  SquareMatrix<4> r;
  undefined1 auStack_b8 [4];
  float local_b4;
  Float local_b0;
  Float local_ac;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  undefined1 auVar15 [16];
  
  auVar16._4_60_ = axis._12_60_;
  auVar16._0_4_ = axis.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15 = auVar16._0_16_;
  auVar14._8_56_ = axis._8_56_;
  auVar14._0_8_ = axis.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  pauVar7 = (undefined1 (*) [16])auStack_b8;
  local_58 = auVar14._0_16_;
  local_68 = vmovshdup_avx(local_58);
  fVar12 = auVar16._0_4_ * auVar16._0_4_ +
           axis.super_Tuple3<pbrt::Vector3,_float>.x * axis.super_Tuple3<pbrt::Vector3,_float>.x +
           local_68._0_4_ * local_68._0_4_;
  if (fVar12 < 0.0) {
    local_b4 = auVar16._0_4_;
    local_b0 = sinTheta;
    local_ac = cosTheta;
    fVar12 = sqrtf(fVar12);
    auVar15 = ZEXT416((uint)local_b4);
    sinTheta = local_b0;
    cosTheta = local_ac;
  }
  else {
    auVar21 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    fVar12 = auVar21._0_4_;
  }
  auVar21._0_4_ = local_68._0_4_ / fVar12;
  auVar21._4_12_ = local_68._4_12_;
  lVar8 = 0;
  auVar11 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  do {
    pauVar7 = pauVar7 + 1;
    auVar10 = vpbroadcastq_avx512vl();
    uVar1 = vpcmpeqq_avx512vl(auVar10,auVar11);
    auVar17 = vpmovm2d_avx512vl(uVar1 & 0xf);
    auVar17 = vpsrld_avx(auVar17,0x1f);
    auVar17 = vcvtdq2ps_avx(auVar17);
    *pauVar7 = auVar17;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  auVar20._0_4_ = local_58._0_4_ / fVar12;
  auVar20._4_12_ = local_58._4_12_;
  auVar13._0_4_ = auVar15._0_4_ / fVar12;
  auVar13._4_12_ = auVar15._4_12_;
  auVar18 = SUB6416(ZEXT464(0x3f800000),0);
  auVar15 = vfnmadd213ss_fma(auVar20,auVar20,auVar18);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * cosTheta)),auVar20,auVar20);
  fVar12 = 1.0 - cosTheta;
  auVar3 = vfmsub213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)(auVar20._0_4_ * auVar21._0_4_)),
                           ZEXT416((uint)(sinTheta * auVar13._0_4_)));
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)(auVar20._0_4_ * auVar13._0_4_)),
                            ZEXT416((uint)(auVar21._0_4_ * sinTheta)));
  lVar8 = 0;
  auVar19 = ZEXT416((uint)fVar12);
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar21._0_4_)),auVar19,
                            ZEXT416((uint)(sinTheta * auVar13._0_4_)));
  auVar6 = vfnmadd213ss_fma(auVar21,auVar21,auVar18);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * cosTheta)),auVar21,auVar21);
  auVar4 = vfmsub213ss_fma(auVar19,ZEXT416((uint)(auVar21._0_4_ * auVar13._0_4_)),
                           ZEXT416((uint)(auVar20._0_4_ * sinTheta)));
  auVar5 = vfmsub213ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar13._0_4_)),auVar19,
                           ZEXT416((uint)(auVar21._0_4_ * sinTheta)));
  auVar21 = vfmadd213ss_fma(auVar19,ZEXT416((uint)(auVar21._0_4_ * auVar13._0_4_)),
                            ZEXT416((uint)(auVar20._0_4_ * sinTheta)));
  auVar18 = vfnmadd231ss_fma(auVar18,auVar13,auVar13);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * cosTheta)),auVar13,auVar13);
  pauVar7 = &local_48;
  do {
    auVar10 = vpbroadcastq_avx512vl();
    uVar1 = vpcmpeqq_avx512vl(auVar10,auVar11);
    auVar13 = vpmovm2d_avx512vl(uVar1 & 0xf);
    auVar13 = vpsrld_avx(auVar13,0x1f);
    auVar13 = vcvtdq2ps_avx(auVar13);
    *pauVar7 = auVar13;
    lVar8 = lVar8 + 1;
    pauVar7 = pauVar7 + 1;
  } while (lVar8 != 4);
  auVar11 = vpbroadcastq_avx512vl();
  auVar11 = vpaddq_avx2(auVar11,_DAT_003f9d80);
  pauVar7 = &local_48;
  puVar9 = (undefined8 *)0x0;
  do {
    auVar10 = vpbroadcastq_avx512vl();
    auVar10 = vpsllq_avx2(auVar10,2);
    vpaddq_avx2(auVar11,auVar10);
    auVar13 = vgatherqps_avx512vl(*puVar9);
    *pauVar7 = auVar13;
    puVar9 = (undefined8 *)((long)puVar9 + 1);
    pauVar7 = pauVar7 + 1;
  } while (puVar9 != (undefined8 *)0x4);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(auVar3._0_4_,auVar2._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = (ulong)auVar15._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(auVar6._0_4_,auVar17._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = (ulong)auVar4._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(auVar21._0_4_,auVar5._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = (ulong)auVar18._0_4_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = uStack_78;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = uStack_70;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_48._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_48._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = uStack_38;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = uStack_30;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = uStack_28;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = uStack_20;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = uStack_18;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = uStack_10;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline Transform Rotate(Float sinTheta, Float cosTheta, Vector3f axis) {
    Vector3f a = Normalize(axis);
    SquareMatrix<4> m;
    // Compute rotation of first basis vector
    m[0][0] = a.x * a.x + (1 - a.x * a.x) * cosTheta;
    m[0][1] = a.x * a.y * (1 - cosTheta) - a.z * sinTheta;
    m[0][2] = a.x * a.z * (1 - cosTheta) + a.y * sinTheta;
    m[0][3] = 0;

    // Compute rotations of second and third basis vectors
    m[1][0] = a.x * a.y * (1 - cosTheta) + a.z * sinTheta;
    m[1][1] = a.y * a.y + (1 - a.y * a.y) * cosTheta;
    m[1][2] = a.y * a.z * (1 - cosTheta) - a.x * sinTheta;
    m[1][3] = 0;

    m[2][0] = a.x * a.z * (1 - cosTheta) - a.y * sinTheta;
    m[2][1] = a.y * a.z * (1 - cosTheta) + a.x * sinTheta;
    m[2][2] = a.z * a.z + (1 - a.z * a.z) * cosTheta;
    m[2][3] = 0;

    return Transform(m, Transpose(m));
}